

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  unsigned_long uVar8;
  char *__s1;
  undefined8 uVar9;
  unsigned_long dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory d;
  string next;
  allocator<char> local_e1;
  Directory local_e0;
  string local_d8;
  cmArchiveWrite *local_b8;
  string local_b0;
  size_t local_80;
  char *local_78;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar6 = strcmp(path,".");
  if (iVar6 == 0) {
    iVar6 = std::__cxx11::string::compare((char *)&this->Format);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&this->Format), iVar6 == 0))
    goto LAB_0011ca63;
  }
  bVar4 = AddFile(this,path,skip,prefix);
  if (!bVar4) {
    return false;
  }
LAB_0011ca63:
  local_b8 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,path,(allocator<char> *)&local_50);
  bVar5 = cmsys::SystemTools::FileIsDirectory(&local_b0);
  bVar4 = true;
  if (bVar5 && recursive) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,path,&local_e1);
    bVar4 = cmsys::SystemTools::FileIsSymlink(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  bVar5 = true;
  if (bVar4 == false) {
    cmsys::Directory::Directory(&local_e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,path,(allocator<char> *)&local_50);
    SVar7 = cmsys::Directory::Load(&local_e0,&local_b0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    bVar5 = true;
    if (SVar7.Kind_ == Success) {
      local_50._M_len = strlen(path);
      local_b0._M_dataplus._M_p = (pointer)0x1;
      local_b0.field_2._M_local_buf[0] = '/';
      local_40 = 1;
      views._M_len = 2;
      views._M_array = &local_50;
      local_b0._M_string_length = (size_type)paVar2;
      local_50._M_str = path;
      local_38 = paVar2;
      cmCatViews_abi_cxx11_(&local_d8,views);
      local_80 = skip;
      local_78 = prefix;
      iVar6 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar6 == 0) {
        psVar1 = &local_b8->Format;
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 == 0)) {
          local_d8._M_string_length = 0;
          *local_d8._M_dataplus._M_p = '\0';
        }
      }
      sVar3 = local_d8._M_string_length;
      uVar8 = cmsys::Directory::GetNumberOfFiles(&local_e0);
      if (uVar8 != 0) {
        dindex = 0;
        do {
          __s1 = cmsys::Directory::GetFile(&local_e0,dindex);
          iVar6 = strcmp(__s1,".");
          if ((iVar6 != 0) && (iVar6 = strcmp(__s1,".."), iVar6 != 0)) {
            if (local_d8._M_string_length < sVar3) {
              uVar9 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",sVar3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::Directory::~Directory(&local_e0);
              _Unwind_Resume(uVar9);
            }
            local_d8._M_dataplus._M_p[sVar3] = '\0';
            local_d8._M_string_length = sVar3;
            std::__cxx11::string::append((char *)&local_d8);
            bVar4 = AddPath(local_b8,local_d8._M_dataplus._M_p,local_80,local_78,true);
            if (!bVar4) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar5 = false;
              goto LAB_0011ccdd;
            }
          }
          dindex = dindex + 1;
        } while (uVar8 != dindex);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0011ccdd:
    cmsys::Directory::~Directory(&local_e0);
  }
  return bVar5;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (strcmp(path, ".") != 0 ||
      (this->Format != "zip" && this->Format != "7zip")) {
    if (!this->AddFile(path, skip, prefix)) {
      return false;
    }
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = cmStrCat(path, '/');
    if (next == "./" && (this->Format == "zip" || this->Format == "7zip")) {
      next.clear();
    }
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}